

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O2

void __thiscall SQTable::AllocNodes(SQTable *this,SQInteger nSize)

{
  _HashNode *p_Var1;
  long lVar2;
  SQObjectValue *pSVar3;
  bool bVar4;
  
  p_Var1 = (_HashNode *)sq_vm_malloc(nSize * 0x28);
  lVar2 = 0;
  if (0 < nSize) {
    lVar2 = nSize;
  }
  pSVar3 = &(p_Var1->key).super_SQObject._unVal;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    pSVar3[-3].fFloat = 2.350989e-38;
    pSVar3[-2].pTable = (SQTable *)0x0;
    ((SQObject *)(pSVar3 + -1))->_type = OT_NULL;
    pSVar3->pTable = (SQTable *)0x0;
    pSVar3[1].pTable = (SQTable *)0x0;
    pSVar3 = pSVar3 + 5;
  }
  this->_numofnodes = nSize;
  this->_nodes = p_Var1;
  this->_firstfree = p_Var1 + nSize + -1;
  return;
}

Assistant:

void SQTable::AllocNodes(SQInteger nSize)
{
    _HashNode *nodes=(_HashNode *)SQ_MALLOC(sizeof(_HashNode)*nSize);
    for(SQInteger i=0;i<nSize;i++){
        _HashNode &n = nodes[i];
        new (&n) _HashNode;
        n.next=NULL;
    }
    _numofnodes=nSize;
    _nodes=nodes;
    _firstfree=&_nodes[_numofnodes-1];
}